

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom(AnyMetadata *this,Message *message)

{
  string *in_stack_00000010;
  Message *in_stack_00000018;
  AnyMetadata *in_stack_00000020;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"type.googleapis.com/",&local_31);
  PackFrom(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message) {
  PackFrom(message, kTypeGoogleApisComPrefix);
}